

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O3

int __thiscall glslang::TPpContext::tMacroInput::scan(tMacroInput *this,TPpToken *ppToken)

{
  undefined1 *puVar1;
  TPpContext *this_00;
  pointer piVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  TokenStream *ts;
  byte bVar7;
  
  do {
    iVar5 = TokenStream::getToken(&this->mac->body,((this->super_tInput).pp)->parseContext,ppToken);
  } while (iVar5 == 0x20);
  bVar7 = this->postpaste;
  if ((bool)bVar7 == true) {
    this->postpaste = false;
  }
  if (this->prepaste == true) {
    if (iVar5 != 0x97) {
      __assert_fail("token == PpAtomPaste",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/preprocessor/Pp.cpp"
                    ,0x45c,"virtual int glslang::TPpContext::tMacroInput::scan(TPpToken *)");
    }
    this->prepaste = false;
    this->postpaste = true;
  }
  bVar4 = TokenStream::peekUntokenizedPasting(&this->mac->body);
  if (bVar4) {
    this->prepaste = true;
    bVar7 = 1;
  }
  if (iVar5 == -1) {
    puVar1 = &this->mac->field_0x48;
    *puVar1 = *puVar1 & 0xfd;
    iVar5 = -1;
  }
  else if (iVar5 == 0xa2) {
    this_00 = (this->super_tInput).pp;
    piVar2 = (this->mac->args).super_vector<int,_glslang::pool_allocator<int>_>.
             super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar6 = (ulong)((long)(this->mac->args).super_vector<int,_glslang::pool_allocator<int>_>.
                          super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar2) >> 2 & 0xffffffff;
    while (0 < (int)uVar6) {
      lVar3 = uVar6 - 1;
      uVar6 = uVar6 - 1;
      iVar5 = strcmp(((this_00->atomStrings).stringMap.
                      super_vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
                      .
                      super__Vector_base<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*,_glslang::pool_allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[piVar2[lVar3]]->_M_dataplus)._M_p,
                     ppToken->name);
      if (iVar5 == 0) {
        ts = (this->expandedArgs).
             super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
             .
             super__Vector_base<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6];
        bVar4 = ts != (TokenStream *)0x0;
        if ((ts == (TokenStream *)0x0) ||
           ((bVar7 != 0 &&
            (((this_00->parseContext->super_TParseVersions).messages & EShMsgReadHlsl) ==
             EShMsgDefault)))) {
          ts = (this->args).
               super_vector<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
               .
               super__Vector_base<glslang::TPpContext::TokenStream_*,_glslang::pool_allocator<glslang::TPpContext::TokenStream_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6];
        }
        pushTokenStreamInput(this_00,ts,this->prepaste,(bool)((bVar7 ^ 1) & bVar4));
        iVar5 = scanToken((this->super_tInput).pp,ppToken);
        return iVar5;
      }
    }
    iVar5 = 0xa2;
  }
  return iVar5;
}

Assistant:

int TPpContext::tMacroInput::scan(TPpToken* ppToken)
{
    int token;
    do {
        token = mac->body.getToken(pp->parseContext, ppToken);
    } while (token == ' ');  // handle white space in macro

    // Hash operators basically turn off a round of macro substitution
    // (the round done on the argument before the round done on the RHS of the
    // macro definition):
    //
    // "A parameter in the replacement list, unless preceded by a # or ##
    // preprocessing token or followed by a ## preprocessing token (see below),
    // is replaced by the corresponding argument after all macros contained
    // therein have been expanded."
    //
    // "If, in the replacement list, a parameter is immediately preceded or
    // followed by a ## preprocessing token, the parameter is replaced by the
    // corresponding argument's preprocessing token sequence."

    bool pasting = false;
    if (postpaste) {
        // don't expand next token
        pasting = true;
        postpaste = false;
    }

    if (prepaste) {
        // already know we should be on a ##, verify
        assert(token == PpAtomPaste);
        prepaste = false;
        postpaste = true;
    }

    // see if are preceding a ##
    if (mac->body.peekUntokenizedPasting()) {
        prepaste = true;
        pasting = true;
    }


    // TODO: preprocessor:  properly handle whitespace (or lack of it) between tokens when expanding
    if (token == PpAtomIdentifier) {
        int i;
        for (i = (int)mac->args.size() - 1; i >= 0; i--)
            if (strcmp(pp->atomStrings.getString(mac->args[i]), ppToken->name) == 0)
                break;
        if (i >= 0) {
            TokenStream* arg = expandedArgs[i];
            bool expanded = !!arg && !pasting;
            // HLSL does expand macros before concatenation
            if (arg == nullptr || (pasting && !pp->parseContext.isReadingHLSL()) ) {
                arg = args[i];
            }
            pp->pushTokenStreamInput(*arg, prepaste, expanded);

            return pp->scanToken(ppToken);
        }
    }

    if (token == EndOfInput)
        mac->busy = 0;

    return token;
}